

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InterfacePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InterfacePortHeaderSyntax,slang::syntax::InterfacePortHeaderSyntax_const&>
          (BumpAllocator *this,InterfacePortHeaderSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  DotMemberClauseSyntax *pDVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  InterfacePortHeaderSyntax *pIVar10;
  
  pIVar10 = (InterfacePortHeaderSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_PortHeaderSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortHeaderSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PortHeaderSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->nameOrKeyword).kind;
  uVar7 = (args->nameOrKeyword).field_0x2;
  NVar8.raw = (args->nameOrKeyword).numFlags.raw;
  uVar9 = (args->nameOrKeyword).rawLen;
  pIVar3 = (args->nameOrKeyword).info;
  pDVar4 = args->modport;
  (pIVar10->super_PortHeaderSyntax).super_SyntaxNode.kind =
       (args->super_PortHeaderSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar10->super_PortHeaderSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pIVar10->super_PortHeaderSyntax).super_SyntaxNode.parent = pSVar1;
  (pIVar10->super_PortHeaderSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pIVar10->nameOrKeyword).kind = TVar6;
  (pIVar10->nameOrKeyword).field_0x2 = uVar7;
  (pIVar10->nameOrKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar10->nameOrKeyword).rawLen = uVar9;
  (pIVar10->nameOrKeyword).info = pIVar3;
  pIVar10->modport = pDVar4;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }